

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O1

uint32_t __thiscall IPStatsRecord::Hash(IPStatsRecord *this)

{
  uint uVar1;
  size_t sVar2;
  
  uVar1 = 0x811c9dc5;
  if (this->ipaddr_length != 0) {
    sVar2 = 0;
    do {
      uVar1 = (uint)this->ip_addr[sVar2] ^ uVar1 * 0x1000193;
      sVar2 = sVar2 + 1;
    } while (this->ipaddr_length != sVar2);
  }
  return uVar1;
}

Assistant:

uint32_t IPStatsRecord::Hash()
{
    const uint32_t fnv_prime_32 = 0x01000193;
    const uint32_t fnv_offset_32 = 0x811c9dc5;
    uint32_t h = fnv_offset_32;
    for (size_t i = 0; i < ipaddr_length; i++) {
        h = h * fnv_prime_32;
        h ^= ip_addr[i];
    }
    return h;
}